

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

string * __thiscall lan::db::pop_next(string *__return_storage_ptr__,db *this,string *content)

{
  char target;
  ssize_t sVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  long local_178;
  long local_160;
  allocator<char> local_119;
  string local_118 [38];
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  ssize_t local_88;
  ssize_t end_p;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  ssize_t start_p;
  string *content_local;
  db *this_local;
  string *str;
  
  start_p = (ssize_t)content;
  content_local = (string *)this;
  this_local = (db *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48," \n\t",&local_49);
  std::__cxx11::string::string((string *)&end_p,(string *)start_p);
  sVar3 = str_find_first_not_of(this,&local_48,(string *)&end_p,0);
  std::__cxx11::string::~string((string *)&end_p);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = sVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"=:;()[] \n\t",&local_a9);
  std::__cxx11::string::string((string *)&local_d0,(string *)start_p);
  local_160 = str_find_first_of(this,&local_a8,&local_d0,local_28);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if ((local_160 < 1) && (-1 < (long)local_28)) {
    local_88 = local_160;
    local_160 = std::__cxx11::string::length();
  }
  local_88 = local_160;
  if (((long)local_28 < 0) || (local_160 < 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_119);
    std::allocator<char>::~allocator(&local_119);
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[](start_p);
    target = *pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,",=:;([])",&local_f1);
    bVar2 = str_compare(this,target,&local_f0);
    if (bVar2) {
      local_178 = local_28 + 1;
    }
    else {
      local_178 = local_88;
    }
    local_88 = local_178;
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    local_f2 = 0;
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,start_p);
    sVar1 = start_p;
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_118,sVar1);
    std::__cxx11::string::operator=((string *)start_p,local_118);
    std::__cxx11::string::~string(local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::pop_next(std::string & content){
            ssize_t start_p = str_find_first_not_of(" \n\t\0", content, 0);
            ssize_t end_p = str_find_first_of("=:;()[] \n\t\0", content, start_p);
            end_p = (end_p <= 0 and start_p >= 0) ? content.length() : end_p;
            if (start_p >= 0 and end_p >= 0){
                end_p = (str_compare(content[start_p], ",=:;([])")) ? start_p+1 : end_p;
                std::string str = content.substr(start_p, end_p-start_p);
                content = content.substr(end_p, content.length() - str.length());
                return str;
            } else return "";
        }